

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fstack.cpp
# Opt level: O2

bool fstk_FindFile(char *path,char **fullPath,size_t *size)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  int *piVar4;
  bool bVar5;
  ulong uVar6;
  char *pcVar7;
  stat statbuf;
  
  if (*size == 0) {
    *size = 0x40;
    pcVar7 = (char *)realloc(*fullPath,0x40);
    *fullPath = pcVar7;
    if (pcVar7 == (char *)0x0) {
      piVar4 = __errno_location();
      pcVar7 = strerror(*piVar4);
      error("realloc error during include path search: %s\n",pcVar7);
      goto LAB_0010afab;
    }
  }
  else {
LAB_0010afab:
    if (*fullPath == (char *)0x0) {
LAB_0010b0de:
      piVar4 = __errno_location();
      *piVar4 = 2;
      bVar5 = false;
      if (generatedMissingIncludes != true) {
        return false;
      }
      goto LAB_0010b0f7;
    }
  }
  uVar6 = 0;
  do {
    if (nbIncPaths < uVar6) goto LAB_0010b0de;
    pcVar7 = "";
    if (uVar6 != 0) {
      pcVar7 = (char *)(&DAT_001a75b8)[uVar6];
    }
    uVar1 = snprintf(*fullPath,*size,"%s%s",pcVar7,path);
    if ((int)uVar1 < 0) {
      pcVar7 = "snprintf error during include path search: %s\n";
LAB_0010b0c5:
      piVar4 = __errno_location();
      pcVar3 = strerror(*piVar4);
      error(pcVar7,pcVar3);
      goto LAB_0010b0de;
    }
    if (*size <= (ulong)uVar1) {
      *size = (ulong)(uVar1 + 1);
      pcVar3 = (char *)realloc(*fullPath,(ulong)(uVar1 + 1));
      *fullPath = pcVar3;
      if (pcVar3 == (char *)0x0) {
        pcVar7 = "realloc error during include path search: %s\n";
      }
      else {
        iVar2 = sprintf(pcVar3,"%s%s",pcVar7,path);
        if (-1 < iVar2) goto LAB_0010b054;
        pcVar7 = "sprintf error during include path search: %s\n";
      }
      goto LAB_0010b0c5;
    }
LAB_0010b054:
    iVar2 = stat(*fullPath,(stat *)&statbuf);
    uVar6 = uVar6 + 1;
  } while ((iVar2 != 0) || ((statbuf.st_mode & 0xf000) == 0x4000));
  path = *fullPath;
  bVar5 = true;
LAB_0010b0f7:
  printDep(path);
  return bVar5;
}

Assistant:

bool fstk_FindFile(char const *path, char **fullPath, size_t *size)
{
	if (!*size) {
		*size = 64; // This is arbitrary, really
		*fullPath = (char *)realloc(*fullPath, *size);
		if (!*fullPath)
			error("realloc error during include path search: %s\n",
			      strerror(errno));
	}

	if (*fullPath) {
		for (size_t i = 0; i <= nbIncPaths; ++i) {
			char const *incPath = i ? includePaths[i - 1] : "";
			int len = snprintf(*fullPath, *size, "%s%s", incPath, path);

			if (len < 0) {
				error("snprintf error during include path search: %s\n",
				      strerror(errno));
				break;
			}

			// Oh how I wish `asnprintf` was standard...
			if ((size_t)len >= *size) { // `size` includes the terminator, `len` doesn't
				*size = len + 1;
				*fullPath = (char *)realloc(*fullPath, *size);
				if (!*fullPath) {
					error("realloc error during include path search: %s\n",
					      strerror(errno));
					break;
				}
				len = sprintf(*fullPath, "%s%s", incPath, path);
				if (len < 0) {
					error("sprintf error during include path search: %s\n",
					       strerror(errno));
					break;
				}
			}

			if (isPathValid(*fullPath)) {
				printDep(*fullPath);
				return true;
			}
		}
	}

	errno = ENOENT;
	if (generatedMissingIncludes)
		printDep(path);
	return false;
}